

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

int16_t object_weight_one(object *obj)

{
  wchar_t local_18;
  int16_t local_12;
  wchar_t i;
  int16_t result;
  object *obj_local;
  
  if (obj->weight < 0) {
    local_12 = 0;
  }
  else {
    local_12 = obj->weight;
  }
  if (obj->curses != (curse_data *)0x0) {
    for (local_18 = L'\x01'; local_18 < (int)(uint)z_info->curse_max; local_18 = local_18 + L'\x01')
    {
      if (obj->curses[local_18].power != L'\0') {
        local_12 = modify_weight_for_curse(local_18,local_12);
      }
    }
  }
  return local_12;
}

Assistant:

int16_t object_weight_one(const struct object *obj)
{
	int16_t result = MAX(obj->weight, 0);

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result = modify_weight_for_curse(i, result);
			}
		}
	}

	return result;
}